

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

uint32_t __thiscall
spirv_cross::CompilerMSL::get_declared_type_size_msl
          (CompilerMSL *this,SPIRType *type,bool is_packed,bool row_major)

{
  uint uVar1;
  bool bVar2;
  uint32_t columns;
  uint32_t uVar3;
  CompilerError *this_00;
  uint uVar4;
  uint32_t uVar5;
  uint uVar6;
  uint32_t uVar7;
  allocator local_49;
  string local_48;
  
  if ((type->pointer == true) && (type->storage == StorageClassPhysicalStorageBuffer)) {
    uVar7 = (uint32_t)(type->array).super_VectorView<unsigned_int>.buffer_size;
    uVar5 = 0x20;
    if (type->vecsize != 3) {
      uVar5 = type->vecsize * 8;
    }
    while ((bVar2 = type_is_pointer(this,type), 0 < (int)uVar7 && (!bVar2))) {
      uVar7 = uVar7 - 1;
      uVar3 = CompilerGLSL::to_array_size_literal(&this->super_CompilerGLSL,type,uVar7);
      uVar5 = uVar5 * uVar3;
      type = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,(type->parent_type).id);
    }
  }
  else {
    uVar6 = *(uint *)&(type->super_IVariant).field_0xc;
    if ((uVar6 < 0x13) && ((0x70803U >> (uVar6 & 0x1f) & 1) != 0)) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_48,"Querying size of opaque object.",&local_49);
      CompilerError::CompilerError(this_00,&local_48);
      __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    if ((type->array).super_VectorView<unsigned_int>.buffer_size == 0) {
      if (uVar6 == 0xf) {
        uVar5 = get_declared_struct_size_msl(this,type,false,false);
        return uVar5;
      }
      uVar6 = type->vecsize;
      uVar4 = type->columns;
      if (!is_packed) {
        uVar1 = uVar4;
        if (row_major && 1 < uVar4) {
          uVar1 = uVar6;
          uVar6 = uVar4;
        }
        uVar4 = 4;
        if (uVar6 != 3) {
          uVar4 = uVar6;
        }
        return (type->width >> 3) * uVar1 * uVar4;
      }
      uVar5 = uVar4 * uVar6;
      uVar6 = type->width >> 3;
    }
    else {
      uVar7 = CompilerGLSL::to_array_size_literal(&this->super_CompilerGLSL,type);
      uVar5 = get_declared_type_array_stride_msl(this,type,is_packed,row_major);
      uVar6 = uVar7 + (uVar7 == 0);
    }
    uVar5 = uVar6 * uVar5;
  }
  return uVar5;
}

Assistant:

uint32_t CompilerMSL::get_declared_type_size_msl(const SPIRType &type, bool is_packed, bool row_major) const
{
	// Pointers take 8 bytes each
	if (type.pointer && type.storage == StorageClassPhysicalStorageBuffer)
	{
		uint32_t type_size = 8 * (type.vecsize == 3 ? 4 : type.vecsize);

		// Work our way through potentially layered arrays,
		// stopping when we hit a pointer that is not also an array.
		int32_t dim_idx = (int32_t)type.array.size() - 1;
		auto *p_type = &type;
		while (!type_is_pointer(*p_type) && dim_idx >= 0)
		{
			type_size *= to_array_size_literal(*p_type, dim_idx);
			p_type = &get<SPIRType>(p_type->parent_type);
			dim_idx--;
		}

		return type_size;
	}

	switch (type.basetype)
	{
	case SPIRType::Unknown:
	case SPIRType::Void:
	case SPIRType::AtomicCounter:
	case SPIRType::Image:
	case SPIRType::SampledImage:
	case SPIRType::Sampler:
		SPIRV_CROSS_THROW("Querying size of opaque object.");

	default:
	{
		if (!type.array.empty())
		{
			uint32_t array_size = to_array_size_literal(type);
			return get_declared_type_array_stride_msl(type, is_packed, row_major) * max(array_size, 1u);
		}

		if (type.basetype == SPIRType::Struct)
			return get_declared_struct_size_msl(type);

		if (is_packed)
		{
			return type.vecsize * type.columns * (type.width / 8);
		}
		else
		{
			// An unpacked 3-element vector or matrix column is the same memory size as a 4-element.
			uint32_t vecsize = type.vecsize;
			uint32_t columns = type.columns;

			if (row_major && columns > 1)
				swap(vecsize, columns);

			if (vecsize == 3)
				vecsize = 4;

			return vecsize * columns * (type.width / 8);
		}
	}
	}
}